

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlBufGetChildContent(xmlBufPtr buf,xmlNode *tree)

{
  xmlNode *local_20;
  xmlNode *cur;
  xmlNode *tree_local;
  xmlBufPtr buf_local;
  
  local_20 = tree->children;
LAB_0016bbdc:
  do {
    if (local_20 == (xmlNode *)0x0) {
      return;
    }
    if (local_20->type - XML_TEXT_NODE < 2) {
      xmlBufCat(buf,local_20->content);
    }
    else if (local_20->type == XML_ENTITY_REF_NODE) {
      xmlBufGetEntityRefContent(buf,local_20);
    }
    else if (local_20->children != (_xmlNode *)0x0) {
      local_20 = local_20->children;
      goto LAB_0016bbdc;
    }
    while (local_20->next == (_xmlNode *)0x0) {
      local_20 = local_20->parent;
      if (local_20 == tree) {
        return;
      }
    }
    local_20 = local_20->next;
  } while( true );
}

Assistant:

static void
xmlBufGetChildContent(xmlBufPtr buf, const xmlNode *tree) {
    const xmlNode *cur = tree->children;

    while (cur != NULL) {
        switch (cur->type) {
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
                xmlBufCat(buf, cur->content);
                break;

            case XML_ENTITY_REF_NODE:
                xmlBufGetEntityRefContent(buf, cur);
                break;

            default:
                if (cur->children != NULL) {
                    cur = cur->children;
                    continue;
                }
                break;
        }

        while (cur->next == NULL) {
            cur = cur->parent;
            if (cur == tree)
                return;
        }
        cur = cur->next;
    }
}